

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Window.cpp
# Opt level: O2

bool __thiscall
gui::DrawWindow(gui *this,IFrameBuffer *fb,TRect client,CWindow *wnd,bool parentDirty)

{
  bool bVar1;
  TPoint this_00;
  TPoint TVar2;
  byte bVar3;
  _List_node_base *p_Var4;
  TRect rect;
  TRect client_00;
  int y;
  int x;
  shared_ptr<gui::CWindow> child;
  CClippedFrameBuffer cfb;
  CTranslatedFrameBuffer tfb;
  int local_b0;
  int local_ac;
  __shared_ptr<gui::CWindow,_(__gnu_cxx::_Lock_policy)2> local_a8;
  TRect local_98;
  TRect local_88;
  CClippedFrameBuffer local_78;
  CTranslatedFrameBuffer local_58;
  
  this_00 = client.p1;
  if (*(bool *)((long)this_00 + 0x750) == true) {
    local_88.p0 = (TPoint)fb;
    local_88.p1 = client.p0;
    CWindow::GetAbsoluteCoords((CWindow *)this_00,&local_ac,&local_b0);
    rect.p1 = client.p0;
    rect.p0 = (TPoint)fb;
    CClippedFrameBuffer::CClippedFrameBuffer(&local_78,(IFrameBuffer *)this,rect);
    TVar2.y = local_b0;
    TVar2.x = local_ac;
    CTranslatedFrameBuffer::CTranslatedFrameBuffer(&local_58,(IFrameBuffer *)&local_78,TVar2);
    bVar3 = (byte)wnd | *(bool *)((long)this_00 + 0x759);
    if (bVar3 == 1) {
      (**(code **)(*(long *)this_00 + 0x40))(this_00,&local_58);
    }
    local_98.p0.x = local_ac;
    local_98.p0.y = local_b0;
    TVar2 = ((TRect *)((long)this_00 + 0x718))->p0;
    local_98.p1.x = (local_ac + (*(TPoint *)((long)this_00 + 0x720)).x) - TVar2.x;
    local_98.p1.y = (local_b0 + (*(TPoint *)((long)this_00 + 0x720)).y) - TVar2.y;
    bVar1 = TRect::ClipRect(&local_88,&local_98);
    if (bVar1) {
      p_Var4 = (_List_node_base *)((long)this_00 + 0x738);
      while (p_Var4 = (((_List_base<std::shared_ptr<gui::CWindow>,_std::allocator<std::shared_ptr<gui::CWindow>_>_>
                         *)&p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
            p_Var4 != (_List_node_base *)((long)this_00 + 0x738)) {
        std::__shared_ptr<gui::CWindow,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_a8,(__shared_ptr<gui::CWindow,_(__gnu_cxx::_Lock_policy)2> *)(p_Var4 + 1))
        ;
        client_00.p1 = (TPoint)local_a8._M_ptr;
        client_00.p0 = local_98.p1;
        bVar1 = DrawWindow(this,(IFrameBuffer *)CONCAT44(local_98.p0.y,local_98.p0.x),client_00,
                           (CWindow *)(ulong)(bVar3 & 1),parentDirty);
        bVar3 = bVar3 | bVar1;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a8._M_refcount);
      }
      *(bool *)((long)this_00 + 0x759) = false;
      goto LAB_0012cfd5;
    }
  }
  bVar3 = 0;
LAB_0012cfd5:
  return (bool)(bVar3 & 1);
}

Assistant:

bool DrawWindow(IFrameBuffer &fb, TRect client, CWindow &wnd, bool parentDirty) {
    if (!wnd.Visible()) {
        return false;
    }

    int x, y;
    wnd.GetAbsoluteCoords(x, y);

    CClippedFrameBuffer cfb(fb, client);
    CTranslatedFrameBuffer tfb(cfb, TPoint(x, y));

    auto dirty = wnd.IsDirty() || parentDirty;
    if (dirty) {
        wnd.Draw(tfb);
    }

    auto thisRect = TRect(x, y, x + wnd.GetWidth() - 1, y + wnd.GetHeight() - 1);
    if (!client.ClipRect(thisRect)) {
        return false;
    }

    for (auto child : wnd.GetChildren()) {
        dirty |= DrawWindow(fb, thisRect, *child.get(), dirty);
    }

    wnd.SetDirty(false);
    return dirty;
}